

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::Histogram
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *histogram)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  pointer puVar6;
  uchar *puVar7;
  uchar *puVar8;
  ulong uVar9;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(image,x,y,width,height);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  uVar5 = height;
  if (image->_rowSize == width) {
    if (width < 0xffffffff / height) {
      uVar5 = 1;
    }
    uVar4 = 1;
    if (width < 0xffffffff / height) {
      uVar4 = height;
    }
    width = width * uVar4;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(histogram,0x100);
  puVar3 = (histogram->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (histogram->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (puVar6 = puVar2; puVar6 != puVar3; puVar6 = puVar6 + 1) {
    *puVar6 = 0;
  }
  uVar1 = image->_rowSize;
  puVar7 = image->_data + (ulong)x + (ulong)(y * uVar1);
  puVar8 = puVar7 + uVar5 * uVar1;
  for (; puVar7 != puVar8; puVar7 = puVar7 + uVar1) {
    for (uVar9 = 0; width != uVar9; uVar9 = uVar9 + 1) {
      puVar3 = puVar2 + puVar7[uVar9];
      *puVar3 = *puVar3 + 1;
    }
  }
  return;
}

Assistant:

void Histogram( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, std::vector < uint32_t > & histogram )
    {
        ParameterValidation( image, x, y, width, height );
        VerifyGrayScaleImage( image );
        OptimiseRoi( width, height, image );

        histogram.resize( 256u );
        std::fill( histogram.begin(), histogram.end(), 0u );

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY = image.data() + y * rowSize + x;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        for( ; imageY != imageYEnd; imageY += rowSize ) {
            const uint8_t * imageX    = imageY;
            const uint8_t * imageXEnd = imageX + width;

            for( ; imageX != imageXEnd; ++imageX )
                ++histogram[*imageX];
        }
    }